

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>,float>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
               *expression)

{
  CoordinateOrder CVar1;
  pointer pfVar2;
  unsigned_long uVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  CoordinateOrder *pCVar7;
  ulong uVar8;
  size_t j_1;
  long lVar9;
  size_t j_2;
  size_t j;
  ulong uVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> coordinate;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_91;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  Marray<float,_std::allocator<unsigned_long>_> local_78;
  
  if ((v->geometry_).size_ == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = (expression->e2_->geometry_).size_ != 0 || (expression->e1_->geometry_).size_ != 0;
  }
  Assert<bool>(bVar4);
  sVar5 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
          ::dimension(expression);
  sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
  Assert<bool>(sVar5 == sVar6);
  sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar5 == 0) {
    if ((v->geometry_).size_ == 1) {
      uVar10 = (expression->e1_->geometry_).size_;
      uVar8 = (expression->e2_->geometry_).size_;
      if (uVar8 < uVar10) {
        uVar8 = uVar10;
      }
      bVar4 = uVar8 == 1;
    }
    else {
      bVar4 = false;
    }
    Assert<bool>(bVar4);
  }
  else {
    for (uVar10 = 0; sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v),
        uVar10 < sVar5; uVar10 = uVar10 + 1) {
      sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar10);
      sVar6 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
              ::shape(expression,uVar10);
      Assert<bool>(sVar5 == sVar6);
    }
  }
  bVar4 = BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
          ::overlaps<float,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
                      *)expression,v);
  if (bVar4) {
    Marray<float,std::allocator<unsigned_long>>::
    Marray<andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>,float>
              ((Marray<float,std::allocator<unsigned_long>> *)&local_78,
               (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>,_float>
                *)expression,(allocator_type *)&local_90);
    operate<andres::marray_detail::Assign<float,float>,float,float,false,std::allocator<unsigned_long>>
              (v,&local_78);
    Marray<float,_std::allocator<unsigned_long>_>::~Marray(&local_78);
  }
  else {
    sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar5 != 0) {
      bVar4 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(v);
      if ((bVar4) &&
         (bVar4 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
                  ::isSimple(expression), bVar4)) {
        View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
        CVar1 = (v->geometry_).coordinateOrder_;
        pCVar7 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
                 ::coordinateOrder(expression);
        if (CVar1 == *pCVar7) {
          pfVar2 = v->data_;
          sVar5 = (v->geometry_).size_;
          for (sVar6 = 0; sVar5 != sVar6; sVar6 = sVar6 + 1) {
            pfVar2[sVar6] = (float)expression->e1_->data_[sVar6] + expression->e2_->data_[sVar6];
          }
          return;
        }
      }
      BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
      ::ExpressionIterator::ExpressionIterator((ExpressionIterator *)&local_78,expression);
      sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,sVar5,&local_91)
      ;
      sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
      lVar9 = 0;
      do {
        v->data_[lVar9] =
             (float)*(int *)((long)local_78.super_View<float,_false,_std::allocator<unsigned_long>_>
                                   .geometry_.shape_ +
                            (long)local_78.super_View<float,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shapeStrides_ * 4) +
             *(float *)(local_78.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                        dimension_ +
                       local_78.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                       size_ * 4);
        for (uVar10 = 0; sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v),
            uVar10 < sVar6; uVar10 = uVar10 + 1) {
          uVar3 = local_90._M_impl.super__Vector_impl_data._M_start[uVar10];
          sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar10);
          if (uVar3 + 1 != sVar6) {
            sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,uVar10);
            BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
            ::ExpressionIterator::incrementCoordinate((ExpressionIterator *)&local_78,uVar10);
            lVar9 = lVar9 + sVar6;
            local_90._M_impl.super__Vector_impl_data._M_start[uVar10] =
                 local_90._M_impl.super__Vector_impl_data._M_start[uVar10] + 1;
            break;
          }
          if (sVar5 - 1 == uVar10) {
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&local_90);
            return;
          }
          uVar3 = local_90._M_impl.super__Vector_impl_data._M_start[uVar10];
          sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,uVar10);
          BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
          ::ExpressionIterator::resetCoordinate((ExpressionIterator *)&local_78,uVar10);
          lVar9 = lVar9 - sVar6 * uVar3;
          local_90._M_impl.super__Vector_impl_data._M_start[uVar10] = 0;
        }
      } while( true );
    }
    *v->data_ = (float)*expression->e1_->data_ + *expression->e2_->data_;
  }
  return;
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}